

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

bool __thiscall cmCTestP4::UpdateImpl(cmCTestP4 *this)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  string *arg;
  pointer pbVar7;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_sync;
  string source;
  OutputLogger err;
  string opts;
  string custom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger out;
  vector<const_char_*,_std::allocator<const_char_*>_> local_278;
  long *local_260 [2];
  long local_250 [2];
  undefined1 local_240 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string local_200;
  string local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"P4UpdateCustom","");
  cmCTest::GetCTestConfiguration(&local_1e0,pcVar1,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  if (local_1e0._M_string_length == 0) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->super_cmCTestGlobalVC).OldRevision);
    if (iVar4 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine,0,
                 (char *)(this->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine.
                         _M_string_length,0x598f15);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"   Unknown current revision\n",0x1c);
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestP4.cxx"
                   ,0x1e8,(char *)local_240._0_8_,false);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar3 = false;
    }
    else {
      local_278.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (char **)0x0;
      local_278.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SetP4Options(this,&local_278);
      local_1a8._0_8_ = "sync";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_278,(char **)local_1a8);
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      local_1a8._0_8_ = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"UpdateOptions","");
      cmCTest::GetCTestConfiguration(&local_200,pcVar1,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      if (local_200._M_string_length == 0) {
        pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        local_240._0_8_ = local_240 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"P4UpdateOptions","");
        cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar1,(string *)local_240);
        std::__cxx11::string::operator=((string *)&local_200,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
      }
      cmSystemTools::ParseArguments(&local_1c0,&local_200);
      if (local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar7 = local_1c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_1a8._0_8_ = (pbVar7->_M_dataplus)._M_p;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_278,
                     (char **)local_1a8);
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != local_1c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
      local_260[0] = local_250;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_260,pcVar2,
                 pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory.
                          _M_string_length);
      std::__cxx11::string::append((char *)local_260);
      iVar4 = cmCTest::GetTestModel((this->super_cmCTestGlobalVC).super_cmCTestVC.CTest);
      if (iVar4 == 1) {
        cmCTestVC::GetNightlyTime_abi_cxx11_((string *)local_1a8,(cmCTestVC *)this);
        if ((ostream *)local_1a8._8_8_ != (ostream *)0x0) {
          poVar6 = (ostream *)0x0;
          do {
            if (*(char *)(local_1a8._0_8_ + (long)poVar6) == '-') {
              *(char *)(local_1a8._0_8_ + (long)poVar6) = '/';
            }
            poVar6 = (ostream *)((long)&poVar6->_vptr_basic_ostream + 1);
          } while ((ostream *)local_1a8._8_8_ != poVar6);
        }
        pcVar5 = (char *)std::__cxx11::string::append((char *)local_260);
        pcVar5 = (char *)std::__cxx11::string::_M_append(pcVar5,local_1a8._0_8_);
        std::__cxx11::string::append(pcVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
      }
      local_1a8._0_8_ = local_260[0];
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_278,(char **)local_1a8);
      local_1a8._0_8_ = (pointer)0x0;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_278,(char **)local_1a8);
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)local_1a8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "p4_sync-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)local_240,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "p4_sync-err> ");
      bVar3 = cmCTestVC::RunUpdateCommand
                        ((cmCTestVC *)this,
                         local_278.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,(OutputParser *)local_1a8,
                         (OutputParser *)local_240,Auto);
      local_240._0_8_ = &PTR__LineParser_0070fd10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._24_8_ != &local_218) {
        operator_delete((void *)local_240._24_8_,local_218._M_allocated_capacity + 1);
      }
      local_1a8._0_8_ = &PTR__LineParser_0070fd10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._8_8_ != local_180) {
        operator_delete((void *)local_198._8_8_,local_180[0]._M_allocated_capacity + 1);
      }
      if (local_260[0] != local_250) {
        operator_delete(local_260[0],local_250[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if (local_278.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (char **)0x0) {
        operator_delete(local_278.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_278.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_278.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    bVar3 = UpdateCustom(this,&local_1e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestP4::UpdateImpl()
{
  std::string custom = this->CTest->GetCTestConfiguration("P4UpdateCustom");
  if (!custom.empty()) {
    return this->UpdateCustom(custom);
  }

  // If we couldn't get a revision number before updating, abort.
  if (this->OldRevision == "<unknown>") {
    this->UpdateCommandLine = "Unknown current revision";
    cmCTestLog(this->CTest, ERROR_MESSAGE, "   Unknown current revision\n");
    return false;
  }

  std::vector<char const*> p4_sync;
  SetP4Options(p4_sync);

  p4_sync.push_back("sync");

  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("P4UpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    p4_sync.push_back(arg.c_str());
  }

  std::string source = this->SourceDirectory + "/...";

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    std::string date = this->GetNightlyTime();
    // CTest reports the date as YYYY-MM-DD, Perforce needs it as YYYY/MM/DD
    std::replace(date.begin(), date.end(), '-', '/');

    // Revision specification: /...@"YYYY/MM/DD HH:MM:SS"
    source.append("@\"").append(date).append("\"");
  }

  p4_sync.push_back(source.c_str());
  p4_sync.push_back(nullptr);

  OutputLogger out(this->Log, "p4_sync-out> ");
  OutputLogger err(this->Log, "p4_sync-err> ");

  return this->RunUpdateCommand(&p4_sync[0], &out, &err);
}